

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

double __thiscall xt::vector::conj(vector *this,double __z)

{
  Object *in_RSI;
  double __z_00;
  double extraout_XMM0_Qa;
  Object local_48;
  shared_ptr<xt::_Vector> local_28;
  Object *val_local;
  
  val_local = (Object *)this;
  empty();
  Object::Object(&local_48,in_RSI);
  conj(__z_00);
  Object::~Object(&local_48);
  std::shared_ptr<xt::_Vector>::~shared_ptr(&local_28);
  return extraout_XMM0_Qa;
}

Assistant:

Vector conj(Object val) {
	return conj(empty(), val);
}